

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::PrintMessagePreamble(cmake *this,MessageType t,ostream *msg)

{
  cmState *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_41;
  string local_40;
  
  switch(t) {
  case FATAL_ERROR:
    pcVar2 = "CMake Error";
    break;
  case INTERNAL_ERROR:
    pcVar2 = "CMake Internal Error (please report a bug)";
    break;
  default:
    std::operator<<(msg,"CMake Warning");
    if (t != AUTHOR_WARNING) {
      return true;
    }
    this_00 = this->State;
    std::__cxx11::string::string((string *)&local_40,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_41);
    pcVar2 = cmState::GetCacheEntryValue(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if ((pcVar2 != (char *)0x0) && (bVar1 = cmSystemTools::IsOn(pcVar2), bVar1)) {
      return false;
    }
    std::operator<<(msg," (dev)");
    return true;
  case LOG:
    pcVar2 = "CMake Debug Log";
    break;
  case DEPRECATION_ERROR:
    pcVar2 = "CMake Deprecation Error";
    break;
  case DEPRECATION_WARNING:
    pcVar2 = "CMake Deprecation Warning";
  }
  std::operator<<(msg,pcVar2);
  return true;
}

Assistant:

bool cmake::PrintMessagePreamble(cmake::MessageType t, std::ostream& msg)
{
  // Construct the message header.
  if(t == cmake::FATAL_ERROR)
    {
    msg << "CMake Error";
    }
  else if(t == cmake::INTERNAL_ERROR)
    {
    msg << "CMake Internal Error (please report a bug)";
    }
  else if(t == cmake::LOG)
    {
    msg << "CMake Debug Log";
    }
  else if(t == cmake::DEPRECATION_ERROR)
    {
    msg << "CMake Deprecation Error";
    }
  else if (t == cmake::DEPRECATION_WARNING)
    {
    msg << "CMake Deprecation Warning";
    }
  else
    {
    msg << "CMake Warning";
    if(t == cmake::AUTHOR_WARNING)
      {
      // Allow suppression of these warnings.
      const char* suppress = this->State->GetCacheEntryValue(
                                        "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
      if(suppress && cmSystemTools::IsOn(suppress))
        {
        return false;
        }
      msg << " (dev)";
      }
    }
  return true;
}